

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O1

void attr_counter_set_free(mtree_writer *mtree)

{
  attr_counter *paVar1;
  attr_counter *paVar2;
  
  paVar2 = (mtree->acs).uid_list;
  if (paVar2 != (attr_counter *)0x0) {
    do {
      paVar1 = paVar2->next;
      free(paVar2);
      paVar2 = paVar1;
    } while (paVar1 != (attr_counter *)0x0);
    (mtree->acs).uid_list = (attr_counter *)0x0;
  }
  paVar2 = (mtree->acs).gid_list;
  if (paVar2 != (attr_counter *)0x0) {
    do {
      paVar1 = paVar2->next;
      free(paVar2);
      paVar2 = paVar1;
    } while (paVar1 != (attr_counter *)0x0);
    (mtree->acs).gid_list = (attr_counter *)0x0;
  }
  paVar2 = (mtree->acs).mode_list;
  if (paVar2 != (attr_counter *)0x0) {
    do {
      paVar1 = paVar2->next;
      free(paVar2);
      paVar2 = paVar1;
    } while (paVar1 != (attr_counter *)0x0);
    (mtree->acs).mode_list = (attr_counter *)0x0;
  }
  paVar2 = (mtree->acs).flags_list;
  if (paVar2 != (attr_counter *)0x0) {
    do {
      paVar1 = paVar2->next;
      free(paVar2);
      paVar2 = paVar1;
    } while (paVar1 != (attr_counter *)0x0);
    (mtree->acs).flags_list = (attr_counter *)0x0;
  }
  return;
}

Assistant:

static void
attr_counter_set_free(struct mtree_writer *mtree)
{
	struct att_counter_set *acs = &mtree->acs;

	attr_counter_free(&acs->uid_list);
	attr_counter_free(&acs->gid_list);
	attr_counter_free(&acs->mode_list);
	attr_counter_free(&acs->flags_list);
}